

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall ParserData::~ParserData(ParserData *this)

{
  pointer ppFVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppFVar4;
  
  ppFVar1 = (this->functions).super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar4 = (this->functions).
                 super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppFVar4 != ppFVar1; ppFVar4 = ppFVar4 + 1) {
    if (*ppFVar4 != (FunctionNode *)0x0) {
      (*((*ppFVar4)->super_Node)._vptr_Node[1])();
    }
  }
  ppFVar4 = (this->functions).super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar4 != (pointer)0x0) {
    operator_delete(ppFVar4,(long)(this->functions).
                                  super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar4
                   );
  }
  pcVar2 = (this->fn)._M_dataplus._M_p;
  paVar3 = &(this->fn).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~ParserData() {
    for (FunctionNode* f : functions)
      delete f;
  }